

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

INT Internal_AddPaddingVfprintf
              (CPalThread *pthrCurrent,PAL_FILE *stream,LPSTR In,INT Padding,INT Flags)

{
  int iVar1;
  errno_t eVar2;
  size_t sVar3;
  CorUnix *this;
  size_t sVar4;
  INT *in_R9;
  int local_50;
  INT local_4c;
  int iLength;
  INT Written;
  LPSTR OutOriginal;
  INT Length;
  INT LengthInStr;
  LPSTR Out;
  INT Flags_local;
  INT Padding_local;
  LPSTR In_local;
  PAL_FILE *stream_local;
  CPalThread *pthrCurrent_local;
  
  sVar3 = strlen(In);
  iVar1 = (int)sVar3;
  OutOriginal._0_4_ = iVar1;
  if (0 < Padding) {
    OutOriginal._0_4_ = Padding + iVar1;
  }
  this = (CorUnix *)CorUnix::InternalMalloc((long)((int)OutOriginal + 1));
  local_50 = (int)OutOriginal + 1;
  if (this == (CorUnix *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      CorUnix::CPalThread::SetLastError(8);
      return -1;
    }
    abort();
  }
  _Length = this;
  if ((Flags & 1U) != 0) {
    eVar2 = strcpy_s((char *)this,(long)local_50,In);
    if (eVar2 != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CorUnix::CPalThread::SetLastError(0x7a);
      local_4c = -1;
      goto LAB_00376e01;
    }
    _Length = this + iVar1;
    local_50 = local_50 - iVar1;
  }
  if (0 < Padding) {
    local_50 = local_50 - Padding;
    Out._4_4_ = Padding;
    if ((Flags & 4U) == 0) {
      while (Out._4_4_ != 0) {
        *_Length = (CorUnix)0x20;
        _Length = _Length + 1;
        Out._4_4_ = Out._4_4_ + -1;
      }
    }
    else {
      while (Out._4_4_ != 0) {
        *_Length = (CorUnix)0x30;
        _Length = _Length + 1;
        Out._4_4_ = Out._4_4_ + -1;
      }
    }
  }
  if (((Flags & 1U) == 0) && (eVar2 = strcpy_s((char *)_Length,(long)local_50,In), eVar2 != 0)) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(0x7a);
    local_4c = -1;
  }
  else {
    sVar4 = CorUnix::InternalFwrite
                      (this,&DAT_00000001,(long)(int)OutOriginal,(size_t)stream->bsdFilePtr,
                       (FILE *)&stream->PALferrorCode,in_R9);
    local_4c = (INT)sVar4;
    if ((stream->PALferrorCode == 1) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
      abort();
    }
  }
LAB_00376e01:
  CorUnix::InternalFree(this);
  return local_4c;
}

Assistant:

INT Internal_AddPaddingVfprintf(CPalThread *pthrCurrent, PAL_FILE *stream, LPSTR In,
                                       INT Padding, INT Flags)
{
    LPSTR Out;
    INT LengthInStr;
    INT Length;
    LPSTR OutOriginal;
    INT Written;

    LengthInStr = strlen(In);
    Length = LengthInStr;

    if (Padding > 0)
    {
        Length += Padding;
    }
    Out = (LPSTR) InternalMalloc(Length+1);
    int iLength = Length+1;
    if (!Out)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return -1;
    }
    OutOriginal = Out;

    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (strcpy_s(Out, iLength, In) != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed\n");
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLength -= LengthInStr;
    }
    if (Padding > 0)
    {
        iLength -= Padding;
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding--)
            {
                *Out++ = '0';
            }
        }
        else /* pad with spaces */
        {
            while (Padding--)
            {
                *Out++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (strcpy_s(Out, iLength, In) != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed\n");
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLength -= LengthInStr;
    }

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr (stream->bsdFilePtr);
#endif

    Written = InternalFwrite(OutOriginal, 1, Length, stream->bsdFilePtr, &stream->PALferrorCode);
    if (stream->PALferrorCode == PAL_FILE_ERROR)
    {
        ERROR("fwrite() failed with errno == %d\n", errno);
    }

Done:
    InternalFree(OutOriginal);

    return Written;
}